

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O1

bool __thiscall
FState::CallAction(FState *this,AActor *self,AActor *stateowner,FStateParamInfo *info,
                  FState **stateret)

{
  VMFunction *pVVar1;
  PPrototype *pPVar2;
  int iVar3;
  FString *this_00;
  long lVar4;
  VMValue params [3];
  VMReturn ret;
  anon_union_16_5_cf148060_for_VMValue_0 local_78;
  AActor *local_68;
  undefined4 local_60;
  undefined1 local_5c;
  FString local_58;
  undefined4 local_50;
  char local_4c [4];
  FStateParamInfo *local_48;
  VMReturn local_40;
  
  pVVar1 = this->ActionFunc;
  if (pVVar1 != (VMFunction *)0x0) {
    local_48 = info;
    clock_gettime(1,(timespec *)&local_78.field_1);
    ActionCycles.Sec =
         ActionCycles.Sec -
         ((double)CONCAT44(local_78.biggest.foo[3],local_78.field_1.atag) * 1e-09 +
         (double)local_78.f);
    if (CallAction(AActor*,AActor*,FStateParamInfo*,FState**)::stack == '\0') {
      iVar3 = __cxa_guard_acquire(&CallAction(AActor*,AActor*,FStateParamInfo*,FState**)::stack);
      if (iVar3 != 0) {
        VMFrameStack::VMFrameStack(&CallAction::stack);
        __cxa_atexit(VMFrameStack::~VMFrameStack,&CallAction::stack,&__dso_handle);
        __cxa_guard_release(&CallAction(AActor*,AActor*,FStateParamInfo*,FState**)::stack);
      }
    }
    local_78.field_1.atag = 1;
    local_78.field_3.Type = 3;
    local_60 = 1;
    local_5c = 3;
    local_58.Chars = (char *)local_48;
    local_50 = 8;
    local_4c[0] = 3;
    if (stateret == (FState **)0x0) {
      stateret = (FState **)0x0;
    }
    else {
      *stateret = (FState *)0x0;
      pPVar2 = this->ActionFunc->Proto;
      if (((pPVar2 == (PPrototype *)0x0) || ((pPVar2->ReturnTypes).Count == 0)) ||
         (*(pPVar2->ReturnTypes).Array != (PType *)TypeState)) {
        stateret = (FState **)0x0;
      }
    }
    local_78.field_1.a = self;
    local_68 = stateowner;
    if (stateret == (FState **)0x0) {
      VMFrameStack::Call(&CallAction::stack,this->ActionFunc,(VMValue *)&local_78.field_1,3,
                         (VMReturn *)0x0,0,(VMException **)0x0);
    }
    else {
      local_40.TagOfs = 0;
      local_40.RegType = '\x03';
      local_40.Location = stateret;
      VMFrameStack::Call(&CallAction::stack,this->ActionFunc,(VMValue *)&local_78.field_1,3,
                         &local_40,1,(VMException **)0x0);
    }
    clock_gettime(1,(timespec *)&local_40);
    ActionCycles.Sec =
         (double)CONCAT53(local_40._11_5_,CONCAT12(local_40.RegType,local_40.TagOfs)) * 1e-09 +
         (double)(long)local_40.Location + ActionCycles.Sec;
    lVar4 = -0x30;
    this_00 = &local_58;
    do {
      if (*(char *)((long)&this_00[1].Chars + 4) == '\x02') {
        FString::~FString(this_00);
      }
      this_00 = this_00 + -2;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0);
  }
  return pVVar1 != (VMFunction *)0x0;
}

Assistant:

bool FState::CallAction(AActor *self, AActor *stateowner, FStateParamInfo *info, FState **stateret)
{
	if (ActionFunc != NULL)
	{
		ActionCycles.Clock();

		static VMFrameStack stack;
		VMValue params[3] = { self, stateowner, VMValue(info, ATAG_STATEINFO) };
		// If the function returns a state, store it at *stateret.
		// If it doesn't return a state but stateret is non-NULL, we need
		// to set *stateret to NULL.
		if (stateret != NULL)
		{
			*stateret = NULL;
			if (ActionFunc->Proto == NULL ||
				ActionFunc->Proto->ReturnTypes.Size() == 0 ||
				ActionFunc->Proto->ReturnTypes[0] != TypeState)
			{
				stateret = NULL;
			}
		}
		if (stateret == NULL)
		{
			stack.Call(ActionFunc, params, countof(params), NULL, 0, NULL);
		}
		else
		{
			VMReturn ret;
			ret.PointerAt((void **)stateret);
			stack.Call(ActionFunc, params, countof(params), &ret, 1, NULL);
		}
		ActionCycles.Unclock();
		return true;
	}
	else
	{
		return false;
	}
}